

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

lhash_bmap_rec * lhMapFindBucket(lhash_kv_engine *pEngine,pgno iLogic)

{
  lhash_bmap_rec *plVar1;
  lhash_bmap_rec **pplVar2;
  
  if (pEngine->nBuckRec != 0) {
    pplVar2 = pEngine->apMap + ((uint)iLogic & pEngine->nBuckSize - 1);
    while (plVar1 = *pplVar2, plVar1 != (lhash_bmap_rec *)0x0) {
      if (plVar1->iLogic == iLogic) {
        return plVar1;
      }
      pplVar2 = &plVar1->pNextCol;
    }
  }
  return (lhash_bmap_rec *)0x0;
}

Assistant:

static lhash_bmap_rec * lhMapFindBucket(lhash_kv_engine *pEngine,pgno iLogic)
{
	lhash_bmap_rec *pRec;
	if( pEngine->nBuckRec < 1 ){
		/* Don't bother */
		return 0;
	}
	pRec = pEngine->apMap[iLogic & (pEngine->nBuckSize - 1)];
	for(;;){
		if( pRec == 0 ){
			break;
		}
		if( pRec->iLogic == iLogic ){
			return pRec;
		}
		/* Point to the next entry */
		pRec = pRec->pNextCol;
	}
	/* No such record */
	return 0;
}